

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O3

int AF_A_FireRailgunRight(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  void *pvVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  uint uVar7;
  AActor *self;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005be06e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_005bdf6d:
        self = (AActor *)0x0;
        pVVar8 = param;
        uVar7 = numparam;
      }
      else {
        pPVar6 = (self->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (self->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar9 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar6 == pPVar4;
        if (!bVar10 && !bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar7 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005be06e;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_005be05e;
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              pPVar6 = (PClass *)puVar2[1];
              if (pPVar6 == (PClass *)0x0) {
                pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
                puVar2[1] = pPVar6;
              }
              bVar9 = pPVar6 != (PClass *)0x0;
              if (pPVar6 != pPVar4 && bVar9) {
                do {
                  pPVar6 = pPVar6->ParentClass;
                  bVar9 = pPVar6 != (PClass *)0x0;
                  if (pPVar6 == pPVar4) break;
                } while (pPVar6 != (PClass *)0x0);
              }
              if (!bVar9) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_005be06e;
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) goto LAB_005be05e;
        }
        if ((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
          if (VVar1 != '\x03') {
LAB_005be086:
            __assertion = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
            ;
            goto LAB_005be06e;
          }
          pvVar3 = param[2].field_0.field_1.a;
          if (param[2].field_0.field_1.atag == 8) {
            if (pvVar3 != (void *)0x0 && self->player != (player_t *)0x0) {
              bVar9 = *(int *)((long)pvVar3 + 8) == 1;
              goto LAB_005be043;
            }
          }
          else if (pvVar3 != (void *)0x0) goto LAB_005be086;
        }
      }
      bVar9 = false;
LAB_005be043:
      FireRailgun(self,10,bVar9);
      return 0;
    }
    if (self == (AActor *)0x0) goto LAB_005bdf6d;
  }
LAB_005be05e:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005be06e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x248,"int AF_A_FireRailgunRight(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireRailgunRight)
{
	PARAM_ACTION_PROLOGUE;
	FireRailgun(self, 10, ACTION_CALL_FROM_PSPRITE());
	return 0;
}